

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QPodArrayOps<QTextUndoCommand>::emplace<QTextUndoCommand_const&>
          (QPodArrayOps<QTextUndoCommand> *this,qsizetype i,QTextUndoCommand *args)

{
  QTextUndoCommand **ppQVar1;
  qsizetype *pqVar2;
  anon_union_8_4_8516307b_for_QTextUndoCommand_8 *paVar3;
  quint32 qVar4;
  Data *pDVar5;
  long lVar6;
  anon_union_8_4_8516307b_for_QTextUndoCommand_8 aVar7;
  quint16 qVar8;
  undefined1 uVar9;
  quint8 qVar10;
  int iVar11;
  quint32 qVar12;
  quint32 qVar13;
  undefined4 uVar14;
  QTextUndoCommand *pQVar15;
  GrowthPosition where;
  
  pDVar5 = (this->super_QArrayDataPointer<QTextUndoCommand>).d;
  if ((pDVar5 == (Data *)0x0) ||
     (1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_004e13f7:
    qVar8 = args->command;
    uVar9 = args->field_0x2;
    qVar10 = args->operation;
    qVar4 = args->pos;
    aVar7 = args->field_8;
    qVar13 = args->revision;
    uVar14 = *(undefined4 *)&args->field_0x1c;
    iVar11 = args->format;
    qVar12 = args->strPos;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QTextUndoCommand>).size != 0);
    QArrayDataPointer<QTextUndoCommand>::detachAndGrow
              (&this->super_QArrayDataPointer<QTextUndoCommand>,where,1,(QTextUndoCommand **)0x0,
               (QArrayDataPointer<QTextUndoCommand> *)0x0);
    pQVar15 = createHole(this,where,i,1);
    pQVar15->command = qVar8;
    pQVar15->field_0x2 = uVar9;
    pQVar15->operation = qVar10;
    pQVar15->format = iVar11;
    pQVar15->strPos = qVar12;
    pQVar15->pos = qVar4;
    pQVar15->field_8 = aVar7;
    pQVar15->revision = qVar13;
    *(undefined4 *)&pQVar15->field_0x1c = uVar14;
  }
  else {
    lVar6 = (this->super_QArrayDataPointer<QTextUndoCommand>).size;
    if ((lVar6 == i && pDVar5 != (Data *)0x0) &&
       ((pDVar5->super_QArrayData).alloc !=
        ((long)((long)(this->super_QArrayDataPointer<QTextUndoCommand>).ptr -
               ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 5) +
        lVar6)) {
      pQVar15 = (this->super_QArrayDataPointer<QTextUndoCommand>).ptr;
      qVar8 = args->command;
      uVar9 = args->field_0x2;
      qVar10 = args->operation;
      iVar11 = args->format;
      qVar4 = args->strPos;
      qVar12 = args->pos;
      aVar7 = *(anon_union_8_4_8516307b_for_QTextUndoCommand_8 *)&args->revision;
      paVar3 = &pQVar15[lVar6].field_8;
      *paVar3 = args->field_8;
      paVar3[1] = aVar7;
      pQVar15 = pQVar15 + lVar6;
      pQVar15->command = qVar8;
      pQVar15->field_0x2 = uVar9;
      pQVar15->operation = qVar10;
      pQVar15->format = iVar11;
      pQVar15->strPos = qVar4;
      pQVar15->pos = qVar12;
    }
    else {
      if (((i != 0) || (pDVar5 == (Data *)0x0)) ||
         ((QTextUndoCommand *)
          ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QArrayDataPointer<QTextUndoCommand>).ptr)) goto LAB_004e13f7;
      pQVar15 = (this->super_QArrayDataPointer<QTextUndoCommand>).ptr;
      qVar8 = args->command;
      uVar9 = args->field_0x2;
      qVar10 = args->operation;
      iVar11 = args->format;
      qVar12 = args->strPos;
      qVar13 = args->pos;
      qVar4 = args->revision;
      uVar14 = *(undefined4 *)&args->field_0x1c;
      pQVar15[-1].field_8 = args->field_8;
      pQVar15[-1].revision = qVar4;
      *(undefined4 *)&pQVar15[-1].field_0x1c = uVar14;
      pQVar15[-1].command = qVar8;
      pQVar15[-1].field_0x2 = uVar9;
      pQVar15[-1].operation = qVar10;
      pQVar15[-1].format = iVar11;
      pQVar15[-1].strPos = qVar12;
      pQVar15[-1].pos = qVar13;
      ppQVar1 = &(this->super_QArrayDataPointer<QTextUndoCommand>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QTextUndoCommand>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }